

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O1

size_t union_uint32(uint32_t *set_1,size_t size_1,uint32_t *set_2,size_t size_2,uint32_t *buffer)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint32_t uVar6;
  size_t n_elems;
  size_t sVar7;
  size_t sVar8;
  
  if (size_2 == 0) {
    memmove(buffer,set_1,size_1 * 4);
    sVar7 = size_1;
  }
  else if (size_1 == 0) {
    memmove(buffer,set_2,size_2 * 4);
    sVar7 = size_2;
  }
  else {
    uVar6 = *set_2;
    uVar3 = 0;
    sVar7 = 0;
    uVar4 = 0;
LAB_0010f917:
    do {
      uVar2 = set_1[uVar3];
      sVar8 = sVar7;
      while (sVar7 = sVar8 + 1, uVar6 <= uVar2) {
        if (uVar2 <= uVar6) {
          buffer[sVar8] = uVar2;
          uVar3 = uVar3 + 1;
          if ((size_1 <= uVar3) || (size_2 <= uVar4 + 1)) {
LAB_0010f96d:
            uVar4 = uVar4 + 1;
            goto LAB_0010f970;
          }
          uVar6 = set_2[uVar4 + 1];
          uVar4 = uVar4 + 1;
          goto LAB_0010f917;
        }
        buffer[sVar8] = uVar6;
        uVar1 = uVar4 + 1;
        if (size_2 <= uVar1) goto LAB_0010f96d;
        uVar4 = uVar1;
        sVar8 = sVar7;
        uVar6 = set_2[uVar1];
      }
      buffer[sVar8] = uVar2;
      uVar3 = uVar3 + 1;
    } while (uVar3 < size_1);
LAB_0010f970:
    lVar5 = size_1 - uVar3;
    if (size_1 < uVar3 || lVar5 == 0) {
      lVar5 = size_2 - uVar4;
      if (uVar4 <= size_2 && lVar5 != 0) {
        memmove(buffer + sVar7,set_2 + uVar4,lVar5 * 4);
        sVar7 = sVar7 + lVar5;
      }
    }
    else {
      memmove(buffer + sVar7,set_1 + uVar3,lVar5 * 4);
      sVar7 = lVar5 + sVar7;
    }
  }
  return sVar7;
}

Assistant:

size_t union_uint32(const uint32_t *set_1, size_t size_1, const uint32_t *set_2,
                    size_t size_2, uint32_t *buffer) {
    size_t pos = 0, idx_1 = 0, idx_2 = 0;

    if (0 == size_2) {
        memmove(buffer, set_1, size_1 * sizeof(uint32_t));
        return size_1;
    }
    if (0 == size_1) {
        memmove(buffer, set_2, size_2 * sizeof(uint32_t));
        return size_2;
    }

    uint32_t val_1 = set_1[idx_1], val_2 = set_2[idx_2];

    while (true) {
        if (val_1 < val_2) {
            buffer[pos++] = val_1;
            ++idx_1;
            if (idx_1 >= size_1) break;
            val_1 = set_1[idx_1];
        } else if (val_2 < val_1) {
            buffer[pos++] = val_2;
            ++idx_2;
            if (idx_2 >= size_2) break;
            val_2 = set_2[idx_2];
        } else {
            buffer[pos++] = val_1;
            ++idx_1;
            ++idx_2;
            if (idx_1 >= size_1 || idx_2 >= size_2) break;
            val_1 = set_1[idx_1];
            val_2 = set_2[idx_2];
        }
    }

    if (idx_1 < size_1) {
        const size_t n_elems = size_1 - idx_1;
        memmove(buffer + pos, set_1 + idx_1, n_elems * sizeof(uint32_t));
        pos += n_elems;
    } else if (idx_2 < size_2) {
        const size_t n_elems = size_2 - idx_2;
        memmove(buffer + pos, set_2 + idx_2, n_elems * sizeof(uint32_t));
        pos += n_elems;
    }

    return pos;
}